

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

ssl_config_data * Curl_ssl_cf_get_config(Curl_cfilter *cf,Curl_easy *data)

{
  ssl_config_data *psVar1;
  
  psVar1 = &(data->set).ssl;
  if ((~cf->cft->flags & 10U) == 0) {
    psVar1 = &(data->set).proxy_ssl;
  }
  return psVar1;
}

Assistant:

struct ssl_config_data *
Curl_ssl_cf_get_config(struct Curl_cfilter *cf, struct Curl_easy *data)
{
#ifdef CURL_DISABLE_PROXY
  (void)cf;
  return &data->set.ssl;
#else
  return Curl_ssl_cf_is_proxy(cf) ? &data->set.proxy_ssl : &data->set.ssl;
#endif
}